

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Ray * __thiscall
pbrt::AnimatedTransform::ApplyInverse
          (Ray *__return_storage_ptr__,AnimatedTransform *this,Ray *r,Float *tMax)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uintptr_t uVar5;
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> IVar8;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  float fVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Float FVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  Transform t;
  Point3fi local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [12];
  float fStack_bc;
  Interval<float> local_b8 [6];
  Float local_88;
  float local_84;
  Float local_80;
  Float local_78;
  float local_74;
  Float local_70;
  Float local_68;
  float local_64;
  Float local_60;
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  if ((this->actuallyAnimated != true) || (fVar30 = r->time, fVar30 <= this->startTime)) {
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
    auVar6._4_4_ = fVar30;
    auVar6._0_4_ = fVar30;
    auVar6._8_4_ = fVar30;
    auVar6._12_4_ = fVar30;
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar21._4_4_ = fVar30;
    auVar21._0_4_ = fVar30;
    auVar21._8_4_ = fVar30;
    auVar21._12_4_ = fVar30;
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar24._4_4_ = fVar30;
    auVar24._0_4_ = fVar30;
    auVar24._8_4_ = fVar30;
    auVar24._12_4_ = fVar30;
    local_108.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar6,auVar21);
    local_108.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)vmovlps_avx(auVar24);
    Transform::ApplyInverse((Point3fi *)local_c8,&this->startTransform,&local_108);
    fVar30 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar7 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->startTransform).mInv.m[0][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->startTransform).mInv.m[0][0])
                            );
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->startTransform).mInv.m[1][1])),
                              ZEXT416((uint)fVar7),
                              ZEXT416((uint)(this->startTransform).mInv.m[1][0]));
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->startTransform).mInv.m[2][1])),
                              ZEXT416((uint)fVar7),
                              ZEXT416((uint)(this->startTransform).mInv.m[2][0]));
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->startTransform).mInv.m[0][2]));
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this->startTransform).mInv.m[1][2]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this->startTransform).mInv.m[2][2]));
  }
  else {
    if (fVar30 < this->endTime) {
      Interpolate((Transform *)local_c8,this,fVar30);
      fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
      auVar9._4_4_ = fVar30;
      auVar9._0_4_ = fVar30;
      auVar9._8_4_ = fVar30;
      auVar9._12_4_ = fVar30;
      fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
      auVar20._4_4_ = fVar30;
      auVar20._0_4_ = fVar30;
      auVar20._8_4_ = fVar30;
      auVar20._12_4_ = fVar30;
      fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
      auVar23._4_4_ = fVar30;
      auVar23._0_4_ = fVar30;
      auVar23._8_4_ = fVar30;
      auVar23._12_4_ = fVar30;
      local_48 = vmovlhps_avx(auVar9,auVar20);
      local_38 = (Interval<float>)vmovlps_avx(auVar23);
      Transform::ApplyInverse(&local_108,(Transform *)local_c8,(Point3fi *)local_48);
      IVar8 = local_108.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
      fVar30 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar7 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
      fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * local_74)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)local_78));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * local_84)),ZEXT416((uint)fVar7),
                                ZEXT416((uint)local_88));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * local_64)),ZEXT416((uint)fVar7),
                                ZEXT416((uint)local_68));
      auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416((uint)local_70));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)local_80));
      auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar1),ZEXT416((uint)local_60));
      fVar7 = auVar6._0_4_;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar21,auVar21);
      auVar9 = vfmadd231ss_fma(auVar9,auVar24,auVar24);
      fVar30 = auVar24._0_4_;
      if (auVar9._0_4_ <= 0.0) {
        auVar12._8_8_ = 0;
        auVar12._0_4_ =
             local_108.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
        auVar12._4_4_ =
             local_108.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      }
      else {
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar20 = vandps_avx(auVar6,auVar28);
        auVar23 = vandps_avx(auVar21,auVar28);
        auVar24 = vandps_avx(auVar24,auVar28);
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ *
                                                (local_108.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high - local_108.
                                                          super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 0.5)),
                                  ZEXT416((uint)((local_108.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high -
                                                 local_108.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 x.low) * 0.5)),auVar23);
        auVar24 = vfmadd231ss_fma(auVar20,ZEXT416((uint)((local_108.
                                                          super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high - local_108.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.low) * 0.5)),auVar24);
        fVar19 = auVar24._0_4_ / auVar9._0_4_;
        fVar1 = auVar21._0_4_ * fVar19;
        i.high = fVar1;
        i.low = fVar1;
        local_e8 = ZEXT416((uint)(fVar7 * fVar19));
        local_d8 = ZEXT416((uint)(fVar30 * fVar19));
        local_108.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar8;
        auVar13._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_108,i);
        auVar13._8_56_ = extraout_var;
        uVar2 = vmovlps_avx(auVar13._0_16_);
        local_108.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar2;
        local_108.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
             (float)(int)((ulong)uVar2 >> 0x20);
        IVar8.high = (float)local_e8._0_4_;
        IVar8.low = (float)local_e8._0_4_;
        auVar14._0_8_ =
             Interval<float>::operator+<float>
                       (&local_108.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,IVar8);
        auVar14._8_56_ = extraout_var_00;
        uVar2 = vmovlps_avx(auVar14._0_16_);
        local_108.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)uVar2;
        local_108.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
             (float)(int)((ulong)uVar2 >> 0x20);
        i_00.high = (float)local_d8._0_4_;
        i_00.low = (float)local_d8._0_4_;
        auVar15._0_8_ =
             Interval<float>::operator+<float>
                       (&local_108.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_00);
        auVar15._8_56_ = extraout_var_01;
        auVar12 = auVar15._0_16_;
        if (tMax != (Float *)0x0) {
          *tMax = *tMax - fVar19;
        }
      }
      auVar24 = vhaddps_avx(auVar12,auVar12);
      fVar7 = auVar24._0_4_;
      FVar27 = r->time;
      uVar5 = (r->medium).
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      auVar21 = vinsertps_avx(auVar21,auVar6,0x10);
      auVar6 = vinsertps_avx((undefined1  [16])
                             local_108.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                             ZEXT416((uint)local_108.super_Point3<pbrt::Interval<float>_>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high
                                    ),0x10);
      goto LAB_00505dc0;
    }
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
    auVar11._4_4_ = fVar30;
    auVar11._0_4_ = fVar30;
    auVar11._8_4_ = fVar30;
    auVar11._12_4_ = fVar30;
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar22._4_4_ = fVar30;
    auVar22._0_4_ = fVar30;
    auVar22._8_4_ = fVar30;
    auVar22._12_4_ = fVar30;
    fVar30 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar26._4_4_ = fVar30;
    auVar26._0_4_ = fVar30;
    auVar26._8_4_ = fVar30;
    auVar26._12_4_ = fVar30;
    local_108.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar11,auVar22);
    local_108.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)vmovlps_avx(auVar26);
    Transform::ApplyInverse((Point3fi *)local_c8,&this->endTransform,&local_108);
    fVar30 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar7 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->endTransform).mInv.m[0][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).mInv.m[0][0]));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->endTransform).mInv.m[1][1])),
                              ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).mInv.m[1][0]))
    ;
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * (this->endTransform).mInv.m[2][1])),
                              ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).mInv.m[2][0]))
    ;
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->endTransform).mInv.m[0][2]));
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this->endTransform).mInv.m[1][2]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar1),
                              ZEXT416((uint)(this->endTransform).mInv.m[2][2]));
  }
  fVar7 = auVar21._0_4_;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar6,auVar6);
  auVar9 = vfmadd231ss_fma(auVar9,auVar24,auVar24);
  fVar30 = auVar24._0_4_;
  if (auVar9._0_4_ <= 0.0) {
    auVar10._4_4_ = local_b8[0].high;
    auVar10._0_4_ = local_b8[0].low;
    auVar10._8_8_ = 0;
  }
  else {
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx(auVar21,auVar29);
    auVar23 = vandps_avx(auVar6,auVar29);
    auVar24 = vandps_avx(auVar24,auVar29);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ *
                                            (fStack_bc - (float)local_c8._8_4_) * 0.5)),
                              ZEXT416((uint)(((float)local_c8._4_4_ - (float)local_c8._0_4_) * 0.5))
                              ,auVar23);
    auVar24 = vfmadd231ss_fma(auVar20,ZEXT416((uint)((local_b8[0].high - local_b8[0].low) * 0.5)),
                              auVar24);
    fVar19 = auVar24._0_4_ / auVar9._0_4_;
    fVar1 = auVar6._0_4_ * fVar19;
    i_01.high = fVar1;
    i_01.low = fVar1;
    local_e8 = ZEXT416((uint)(fVar7 * fVar19));
    local_d8 = ZEXT416((uint)(fVar30 * fVar19));
    auVar16._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_c8,i_01);
    auVar16._8_56_ = extraout_var_02;
    uVar2 = vmovlps_avx(auVar16._0_16_);
    local_c8._0_4_ = (undefined4)uVar2;
    local_c8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    i_02.high = (float)local_e8._0_4_;
    i_02.low = (float)local_e8._0_4_;
    auVar17._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_c8 + 8),i_02);
    auVar17._8_56_ = extraout_var_03;
    uVar2 = vmovlps_avx(auVar17._0_16_);
    local_c8._8_4_ = (undefined4)uVar2;
    fStack_bc = (float)((ulong)uVar2 >> 0x20);
    i_03.high = (float)local_d8._0_4_;
    i_03.low = (float)local_d8._0_4_;
    auVar18._0_8_ = Interval<float>::operator+<float>(local_b8,i_03);
    auVar18._8_56_ = extraout_var_04;
    auVar10 = auVar18._0_16_;
    if (tMax != (Float *)0x0) {
      *tMax = *tMax - fVar19;
    }
  }
  auVar24 = vhaddps_avx(auVar10,auVar10);
  fVar7 = auVar24._0_4_;
  auVar4._4_4_ = local_c8._4_4_;
  auVar4._0_4_ = local_c8._0_4_;
  auVar4._8_4_ = local_c8._8_4_;
  auVar4._12_4_ = fStack_bc;
  FVar27 = r->time;
  local_108.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = (float)local_c8._8_4_;
  local_108.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = (float)local_c8._4_4_;
  uVar5 = (r->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  auVar21 = vinsertps_avx(auVar6,auVar21,0x10);
  auVar6 = vinsertps_avx(auVar4,ZEXT416((uint)fStack_bc),0x10);
LAB_00505dc0:
  auVar25._0_4_ =
       local_108.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar25._4_4_ =
       local_108.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar25._8_4_ = auVar6._8_4_ + 0.0;
  auVar25._12_4_ = auVar6._12_4_ + 0.0;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar6 = vmulps_avx512vl(auVar25,auVar3);
  uVar2 = vmovlps_avx(auVar6);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = fVar7 * 0.5;
  uVar2 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = fVar30;
  __return_storage_ptr__->time = FVar27;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar5;
  return __return_storage_ptr__;
}

Assistant:

Ray AnimatedTransform::ApplyInverse(const Ray &r, Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform.ApplyInverse(r, tMax);
    else if (r.time >= endTime)
        return endTransform.ApplyInverse(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t.ApplyInverse(r, tMax);
    }
}